

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O3

void __thiscall
agge::tests::QuadraticBezierCurveTests::CoarseQBezier2ProducesLine(QuadraticBezierCurveTests *this)

{
  FailedAssertion *pFVar1;
  bool bVar2;
  long lVar3;
  qbezier b2;
  qbezier b1;
  undefined1 local_1a0 [8];
  undefined4 local_198;
  char local_190 [24];
  string local_178;
  int local_158;
  point local_148;
  undefined8 local_13c;
  undefined4 local_134;
  undefined8 local_130;
  undefined4 local_128;
  point local_118;
  undefined8 local_10c;
  undefined4 local_104;
  undefined8 local_100;
  undefined4 local_f8;
  pointer local_e8;
  int local_e0;
  pointer local_dc;
  int local_d4;
  char *local_d0;
  int local_c8;
  string local_c0;
  real_t *local_a0 [2];
  real_t local_90 [6];
  string local_78;
  qbezier local_54;
  
  qbezier::qbezier(&local_54,0.0,0.0,1.0,1.0,2.0,0.0,100.0);
  local_198 = 0;
  local_1a0 = (undefined1  [8])0x0;
  local_e0 = qbezier::vertex(&local_54,(real_t *)local_1a0,(real_t *)(local_1a0 + 4));
  local_e8 = (pointer)local_1a0;
  local_198 = 0;
  local_1a0 = (undefined1  [8])0x0;
  local_d4 = qbezier::vertex(&local_54,(real_t *)local_1a0,(real_t *)(local_1a0 + 4));
  local_dc = (pointer)local_1a0;
  local_198 = 0;
  local_1a0 = (undefined1  [8])0x0;
  local_c8 = qbezier::vertex(&local_54,(real_t *)local_1a0,(real_t *)(local_1a0 + 4));
  local_d0 = (char *)local_1a0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  local_118.command = 1;
  local_10c = 0x40000000;
  local_104 = 2;
  local_100 = 0;
  local_f8 = 0;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_1a0,&local_178,0x2e);
  lVar3 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)((long)&local_118.x + lVar3),(point *)((long)&local_e8 + lVar3));
    if (!bVar2) {
      pFVar1 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_a0[0] = &((qbezier *)local_a0)->_xe;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar1,(string *)local_a0,(LocationInfo *)local_1a0);
      __cxa_throw(pFVar1,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x24);
  if (local_1a0 != (undefined1  [8])local_190) {
    operator_delete((void *)local_1a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  qbezier::qbezier((qbezier *)local_a0,10.0,11.0,1.0,1.0,13.0,17.0,100.0);
  local_198 = 0;
  local_1a0 = (undefined1  [8])0x0;
  local_178._M_string_length._0_4_ =
       qbezier::vertex((qbezier *)local_a0,(real_t *)local_1a0,(real_t *)(local_1a0 + 4));
  local_178._M_dataplus._M_p = (pointer)local_1a0;
  local_198 = 0;
  local_1a0 = (undefined1  [8])0x0;
  local_178.field_2._M_allocated_capacity._4_4_ =
       qbezier::vertex((qbezier *)local_a0,(real_t *)local_1a0,(real_t *)(local_1a0 + 4));
  local_178._12_8_ = local_1a0;
  local_198 = 0;
  local_1a0 = (undefined1  [8])0x0;
  local_158 = qbezier::vertex((qbezier *)local_a0,(real_t *)local_1a0,(real_t *)(local_1a0 + 4));
  local_178.field_2._8_8_ = local_1a0;
  local_148.x = 10.0;
  local_148.y = 11.0;
  local_148.command = 1;
  local_13c = 0x4188000041500000;
  local_134 = 2;
  local_130 = 0;
  local_128 = 0;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_1a0,&local_c0,0x39);
  lVar3 = 0;
  do {
    bVar2 = mocks::path::point::operator==
                      ((point *)((long)&local_148.x + lVar3),
                       (point *)((long)&local_178._M_dataplus._M_p + lVar3));
    if (!bVar2) {
      pFVar1 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(pFVar1,&local_78,(LocationInfo *)local_1a0);
      __cxa_throw(pFVar1,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0x24);
  if (local_1a0 != (undefined1  [8])local_190) {
    operator_delete((void *)local_1a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( CoarseQBezier2ProducesLine )
			{
				// INIT
				qbezier b1(0.0f, 0.0f, 1.0f, 1.0f, 2.0f, 0.0f, 100.0f /* ridiculously big step */);

				// ACT
				mocks::path::point points1[] = { vertex(b1), vertex(b1), vertex(b1), };

				// ASSERT
				mocks::path::point reference1[] = { moveto(0.0f, 0.0f), lineto(2.0f, 0.0f), stop(), };

				assert_equal(reference1, points1);

				// INIT
				qbezier b2(10.0f, 11.0f, 1.0f, 1.0f, 13.0f, 17.0f, 100.0f /* ridiculously big step */);

				// ACT
				mocks::path::point points2[] = { vertex(b2), vertex(b2), vertex(b2), };

				// ASSERT
				mocks::path::point reference2[] = { moveto(10.0f, 11.0f), lineto(13.0f, 17.0f), stop(), };

				assert_equal(reference2, points2);
			}